

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_getnameinfo.c
# Opt level: O3

char * lookup_service(unsigned_short port,uint flags,char *buf,size_t buflen)

{
  int iVar1;
  size_t sVar2;
  undefined6 in_register_0000003a;
  char *pcVar3;
  servent *sep;
  servent se;
  char tmpbuf [4096];
  servent *local_1060;
  servent local_1058;
  char local_1038 [4104];
  
  if ((int)CONCAT62(in_register_0000003a,port) == 0) {
    *buf = '\0';
    return (char *)0x0;
  }
  if ((flags & 8) == 0) {
    if ((flags & 0x10) == 0) {
      if ((flags & 0x20) == 0) {
        pcVar3 = "dccp";
        if ((flags & 0x40) == 0) {
          pcVar3 = "tcp";
        }
      }
      else {
        pcVar3 = "sctp";
      }
    }
    else {
      pcVar3 = "udp";
    }
    local_1058.s_port = 0;
    local_1058._20_4_ = 0;
    local_1058.s_proto = (char *)0x0;
    local_1058.s_name = (char *)0x0;
    local_1058.s_aliases = (char **)0x0;
    local_1060 = &local_1058;
    memset(local_1038,0,0x1000);
    iVar1 = getservbyport_r((uint)port,pcVar3,&local_1058,local_1038,0x1000,&local_1060);
    if (iVar1 != 0) goto LAB_00110e8d;
    if ((local_1060 != (servent *)0x0) && (pcVar3 = local_1060->s_name, pcVar3 != (char *)0x0))
    goto LAB_00110eb8;
  }
  else {
LAB_00110e8d:
    local_1060 = (servent *)0x0;
  }
  pcVar3 = local_1038;
  snprintf(pcVar3,0x1000,"%u",(ulong)(ushort)(port << 8 | port >> 8));
LAB_00110eb8:
  sVar2 = ares_strlen(pcVar3);
  if (sVar2 < 0x21) {
    memcpy(buf,pcVar3,sVar2 + 1);
  }
  else {
    *buf = '\0';
  }
  return buf;
}

Assistant:

static char *lookup_service(unsigned short port, unsigned int flags, char *buf,
                            size_t buflen)
{
  const char     *proto;
  struct servent *sep;
#ifdef HAVE_GETSERVBYPORT_R
  struct servent se;
#endif
  char        tmpbuf[4096];
  const char *name;
  size_t      name_len;

  if (port) {
    if (flags & ARES_NI_NUMERICSERV) {
      sep = NULL;
    } else {
      if (flags & ARES_NI_UDP) {
        proto = "udp";
      } else if (flags & ARES_NI_SCTP) {
        proto = "sctp";
      } else if (flags & ARES_NI_DCCP) {
        proto = "dccp";
      } else {
        proto = "tcp";
      }
#ifdef HAVE_GETSERVBYPORT_R
      memset(&se, 0, sizeof(se));
      sep = &se;
      memset(tmpbuf, 0, sizeof(tmpbuf));
#  if GETSERVBYPORT_R_ARGS == 6
      if (getservbyport_r(port, proto, &se, (void *)tmpbuf, sizeof(tmpbuf),
                          &sep) != 0) {
        sep = NULL; /* LCOV_EXCL_LINE: buffer large so this never fails */
      }
#  elif GETSERVBYPORT_R_ARGS == 5
      sep = getservbyport_r(port, proto, &se, (void *)tmpbuf, sizeof(tmpbuf));
#  elif GETSERVBYPORT_R_ARGS == 4
      if (getservbyport_r(port, proto, &se, (void *)tmpbuf) != 0) {
        sep = NULL;
      }
#  else
      /* Lets just hope the OS uses TLS! */
      sep = getservbyport(port, proto);
#  endif
#else
      /* Lets just hope the OS uses TLS! */
#  if (defined(NETWARE) && !defined(__NOVELL_LIBC__))
      sep = getservbyport(port, (char *)proto);
#  else
      sep = getservbyport(port, proto);
#  endif
#endif
    }
    if (sep && sep->s_name) {
      /* get service name */
      name = sep->s_name;
    } else {
      /* get port as a string */
      snprintf(tmpbuf, sizeof(tmpbuf), "%u", (unsigned int)ntohs(port));
      name = tmpbuf;
    }
    name_len = ares_strlen(name);
    if (name_len < buflen) {
      /* return it if buffer big enough */
      memcpy(buf, name, name_len + 1);
    } else {
      /* avoid reusing previous one */
      buf[0] = '\0'; /* LCOV_EXCL_LINE: no real service names are too big */
    }
    return buf;
  }
  buf[0] = '\0';
  return NULL;
}